

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_array_numeric_suite.cpp
# Opt level: O2

void numeric_suite::test_adjacent_difference(void)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first_end;
  basic_iterator<int> __first;
  basic_iterator<int> __last;
  initializer_list<int> __l;
  allocator_type local_89;
  vector<int,_std::allocator<int>_> expect;
  vector<int,_std::allocator<int>_> result;
  int local_54 [3];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 *local_38;
  undefined8 local_30;
  undefined8 local_28;
  
  local_48 = 0x160000000b;
  uStack_40 = 0x21;
  local_38 = &local_48;
  local_30 = 3;
  local_28 = 3;
  std::vector<int,_std::allocator<int>_>::vector(&result,4,(allocator_type *)&expect);
  __first.current._0_4_ = (uint)local_28 - (int)local_30 & 7;
  __last.current._0_4_ = (uint)local_28 & 7;
  __first.parent = (view_pointer)&local_38;
  __first.current._4_4_ = 0;
  __last.parent = (view_pointer)&local_38;
  __last.current._4_4_ = 0;
  first_end = std::
              adjacent_difference<vista::circular_view<int,4ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                        (__first,__last,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                         result.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start);
  local_54[0] = 0xb;
  local_54[1] = 0xb;
  local_54[2] = 0xb;
  __l._M_len = 3;
  __l._M_array = local_54;
  std::vector<int,_std::allocator<int>_>::vector(&expect,__l,&local_89);
  boost::detail::
  test_all_eq_impl<std::ostream,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_array_numeric_suite.cpp"
             ,0x2b,"void numeric_suite::test_adjacent_difference()",
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&expect.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&result.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void test_adjacent_difference_back_inserter()
{
    std::vector<int> data = {11, 22, 33, 44, 55};
    circular_array<int, 4> result;
    std::adjacent_difference(data.begin(), data.end(), std::back_inserter(result));
    std::vector<int> expect = {22 - 11, 33 - 22, 44 - 33, 55 - 44};
    BOOST_TEST_ALL_EQ(result.begin(), result.end(), expect.begin(), expect.end());
}